

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# polymul.hpp
# Opt level: O2

double polymul_internal::polynomial_evaluator<double,_double,_2,_2>::eval(double *p,double *x)

{
  int iVar1;
  double dVar2;
  
  iVar1 = binomial(3,1);
  dVar2 = eval_monomial(p + iVar1,x);
  return dVar2 + *x * p[1] + x[1] * p[2] + *p;
}

Assistant:

static vartype eval(const numtype p[], const vartype x[]) {
    return polynomial_evaluator<numtype, vartype, Nvar, Ndeg>::eval_monomial(
               p + binomial(Nvar + Ndeg - 1, Ndeg - 1), x) +
           polynomial_evaluator<numtype, vartype, Nvar, Ndeg - 1>::eval(p, x);
  }